

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ItemSize(ImVec2 *size,float text_baseline_y)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float line_height;
  float line_y1;
  float offset_to_match_baseline_y;
  ImGuiWindow *window;
  ImGuiContext *g;
  float local_34;
  float local_30;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->SkipItems & 1U) == 0) {
    if (in_XMM0_Da < 0.0) {
      local_30 = 0.0;
    }
    else {
      local_30 = ImMax<float>(0.0,(pIVar1->DC).CurrLineTextBaseOffset - in_XMM0_Da);
    }
    if (((pIVar1->DC).IsSameLine & 1U) == 0) {
      local_34 = (pIVar1->DC).CursorPos.y;
    }
    else {
      local_34 = (pIVar1->DC).CursorPosPrevLine.y;
    }
    fVar3 = ImMax<float>((pIVar1->DC).CurrLineSize.y,
                         ((pIVar1->DC).CursorPos.y - local_34) + in_RDI[1] + local_30);
    (pIVar1->DC).CursorPosPrevLine.x = (pIVar1->DC).CursorPos.x + *in_RDI;
    (pIVar1->DC).CursorPosPrevLine.y = local_34;
    (pIVar1->DC).CursorPos.x =
         (float)(int)((pIVar1->Pos).x + (pIVar1->DC).Indent.x + (pIVar1->DC).ColumnsOffset.x);
    (pIVar1->DC).CursorPos.y = (float)(int)(local_34 + fVar3 + (pIVar2->Style).ItemSpacing.y);
    fVar4 = ImMax<float>((pIVar1->DC).CursorMaxPos.x,(pIVar1->DC).CursorPosPrevLine.x);
    (pIVar1->DC).CursorMaxPos.x = fVar4;
    fVar4 = ImMax<float>((pIVar1->DC).CursorMaxPos.y,
                         (pIVar1->DC).CursorPos.y - (pIVar2->Style).ItemSpacing.y);
    (pIVar1->DC).CursorMaxPos.y = fVar4;
    (pIVar1->DC).PrevLineSize.y = fVar3;
    (pIVar1->DC).CurrLineSize.y = 0.0;
    fVar3 = ImMax<float>((pIVar1->DC).CurrLineTextBaseOffset,in_XMM0_Da);
    (pIVar1->DC).PrevLineTextBaseOffset = fVar3;
    (pIVar1->DC).CurrLineTextBaseOffset = 0.0;
    (pIVar1->DC).IsSetPos = false;
    (pIVar1->DC).IsSameLine = false;
    if ((pIVar1->DC).LayoutType == 0) {
      SameLine(0.0,-1.0);
    }
  }
  return;
}

Assistant:

void ImGui::ItemSize(const ImVec2& size, float text_baseline_y)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    // We increase the height in this function to accommodate for baseline offset.
    // In theory we should be offsetting the starting position (window->DC.CursorPos), that will be the topic of a larger refactor,
    // but since ItemSize() is not yet an API that moves the cursor (to handle e.g. wrapping) enlarging the height has the same effect.
    const float offset_to_match_baseline_y = (text_baseline_y >= 0) ? ImMax(0.0f, window->DC.CurrLineTextBaseOffset - text_baseline_y) : 0.0f;

    const float line_y1 = window->DC.IsSameLine ? window->DC.CursorPosPrevLine.y : window->DC.CursorPos.y;
    const float line_height = ImMax(window->DC.CurrLineSize.y, /*ImMax(*/window->DC.CursorPos.y - line_y1/*, 0.0f)*/ + size.y + offset_to_match_baseline_y);

    // Always align ourselves on pixel boundaries
    //if (g.IO.KeyAlt) window->DrawList->AddRect(window->DC.CursorPos, window->DC.CursorPos + ImVec2(size.x, line_height), IM_COL32(255,0,0,200)); // [DEBUG]
    window->DC.CursorPosPrevLine.x = window->DC.CursorPos.x + size.x;
    window->DC.CursorPosPrevLine.y = line_y1;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);    // Next line
    window->DC.CursorPos.y = IM_FLOOR(line_y1 + line_height + g.Style.ItemSpacing.y);                    // Next line
    window->DC.CursorMaxPos.x = ImMax(window->DC.CursorMaxPos.x, window->DC.CursorPosPrevLine.x);
    window->DC.CursorMaxPos.y = ImMax(window->DC.CursorMaxPos.y, window->DC.CursorPos.y - g.Style.ItemSpacing.y);
    //if (g.IO.KeyAlt) window->DrawList->AddCircle(window->DC.CursorMaxPos, 3.0f, IM_COL32(255,0,0,255), 4); // [DEBUG]

    window->DC.PrevLineSize.y = line_height;
    window->DC.CurrLineSize.y = 0.0f;
    window->DC.PrevLineTextBaseOffset = ImMax(window->DC.CurrLineTextBaseOffset, text_baseline_y);
    window->DC.CurrLineTextBaseOffset = 0.0f;
    window->DC.IsSameLine = window->DC.IsSetPos = false;

    // Horizontal layout mode
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
        SameLine();
}